

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int extraout_EAX;
  ulong uVar4;
  char *__addr;
  long lVar5;
  long lVar6;
  int *piVar7;
  int *piVar8;
  int iVar9;
  int *piVar10;
  advent_t *paVar11;
  ulong uVar12;
  int *piVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int *piVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  int *piVar21;
  int iVar22;
  undefined8 uVar23;
  byte bVar24;
  byte bVar25;
  ulong uVar26;
  ushort uVar27;
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar28 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  double local_38;
  
  local_38 = 0.0;
  lVar20 = 8;
  paVar11 = advent2018;
  while( true ) {
    uVar14 = 0x100000;
    load_input(input_t&,std::__cxx11::string_const&)::backsplash =
         (char *)mmap(load_input(input_t&,std::__cxx11::string_const&)::backsplash,0x100000,1,
                      (uint)(load_input(input_t&,std::__cxx11::string_const&)::backsplash !=
                            (char *)0x0) << 4 | 0x22,-1,0);
    if (load_input(input_t&,std::__cxx11::string_const&)::backsplash == (char *)0xffffffffffffffff)
    break;
    uVar4 = 0;
    iVar3 = open(*(char **)((long)&advent2018[0].fn + lVar20),0);
    if (iVar3 == -1) goto LAB_00102f01;
    uVar14 = 0;
    uVar4 = lseek(iVar3,0,2);
    if (0x100000 < uVar4) {
LAB_00102ef2:
      main_cold_5();
LAB_00102ef7:
      main_cold_4();
      break;
    }
    uVar14 = uVar4;
    __addr = (char *)mmap(load_input(input_t&,std::__cxx11::string_const&)::backsplash,uVar4,1,0x12,
                          iVar3,0);
    if (__addr == (char *)0xffffffffffffffff) goto LAB_00102ef7;
    if (__addr != load_input(input_t&,std::__cxx11::string_const&)::backsplash) {
      main_cold_1();
    }
    iVar3 = close(iVar3);
    if (iVar3 == -1) {
      paVar11 = (advent_t *)((long)&advent2018[0].fn + lVar20);
      main_cold_3();
      goto LAB_00102ef2;
    }
    lVar5 = std::chrono::_V2::steady_clock::now();
    (**(code **)(lVar20 + 0x11c178))(__addr,uVar4);
    lVar6 = std::chrono::_V2::steady_clock::now();
    iVar3 = munmap(__addr,uVar4);
    if (iVar3 == -1) goto LAB_00102f0c;
    local_38 = local_38 + (double)(lVar6 - lVar5);
    printf(anon_var_dwarf_2d29,(long)((double)(lVar6 - lVar5) * 0.001));
    lVar20 = lVar20 + 0x28;
    if (lVar20 == 0x3f0) {
      printf(anon_var_dwarf_2d3f,(long)(local_38 * 0.001));
      return 0;
    }
  }
  main_cold_7();
  uVar4 = uVar14;
LAB_00102f01:
  __addr = (char *)((long)&paVar11->fn + lVar20);
  main_cold_6();
LAB_00102f0c:
  main_cold_2();
  piVar7 = (int *)operator_new(12000);
  piVar13 = piVar7 + 3000;
  piVar17 = piVar7;
  if (uVar4 != 0) {
    iVar3 = 0;
    uVar18 = 0;
    iVar22 = 0;
    do {
      bVar24 = *__addr - 0x30;
      if (bVar24 < 10) {
        iVar3 = (uint)bVar24 + iVar3 * 10;
      }
      else {
        uVar18 = uVar18 | *__addr == '-';
        if (iVar3 == 0) {
          iVar3 = 0;
        }
        else {
          iVar22 = (-uVar18 ^ iVar3 - uVar18) + iVar22;
          lVar20 = (long)piVar17 - (long)piVar7 >> 2;
          uVar14 = lVar20 * -0x5555555555555555;
          if (piVar17 == piVar13) {
            if ((long)piVar17 - (long)piVar7 == 0x7ffffffffffffff8) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar26 = uVar14;
            if (piVar17 == piVar7) {
              uVar26 = 1;
            }
            uVar12 = uVar26 + uVar14;
            if (0xaaaaaaaaaaaaaa9 < uVar12) {
              uVar12 = 0xaaaaaaaaaaaaaaa;
            }
            if (CARRY8(uVar26,uVar14)) {
              uVar12 = 0xaaaaaaaaaaaaaaa;
            }
            if (uVar12 == 0) {
              piVar8 = (int *)0x0;
            }
            else {
              piVar8 = (int *)operator_new(uVar12 * 0xc);
            }
            piVar8[lVar20] = iVar22;
            piVar8[lVar20 + 1] = 0;
            piVar8[lVar20 + 2] = (int)uVar14;
            piVar21 = piVar8;
            for (piVar10 = piVar7; piVar17 != piVar10; piVar10 = piVar10 + 3) {
              piVar21[2] = piVar10[2];
              *(undefined8 *)piVar21 = *(undefined8 *)piVar10;
              piVar21 = piVar21 + 3;
            }
            if (piVar7 != (int *)0x0) {
              operator_delete(piVar7,(long)piVar13 - (long)piVar7);
            }
            piVar13 = piVar8 + uVar12 * 3;
          }
          else {
            *piVar17 = iVar22;
            piVar17[1] = 0;
            piVar17[2] = (int)uVar14;
            piVar8 = piVar7;
            piVar21 = piVar17;
          }
          uVar18 = 0;
          piVar17 = piVar21 + 3;
          iVar3 = 0;
          piVar7 = piVar8;
        }
      }
      uVar4 = uVar4 - 1;
      __addr = __addr + 1;
    } while (uVar4 != 0);
  }
  uVar18 = piVar17[-3];
  if (piVar7 != piVar17) {
    auVar30 = vpbroadcastq_avx512f();
    auVar30 = vpsrlq_avx512f(auVar30,3);
    auVar31 = vpbroadcastd_avx512f();
    uVar14 = 0;
    auVar32 = vpmovzxbq_avx512f(ZEXT816(0xb4a89c9084786c60));
    auVar33 = vpmovsxbq_avx512f(ZEXT816(0x54483c3024180c00));
    auVar34 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovzxbd_avx512f(_DAT_001153a8);
    auVar36 = vpbroadcastq_avx512f(ZEXT816(4));
    auVar37 = vpternlogd_avx512f(in_ZMM8,in_ZMM8,in_ZMM8,0xff);
    piVar8 = piVar7;
    do {
      auVar38 = vpbroadcastq_avx512f();
      auVar39 = vporq_avx512f(auVar38,auVar34);
      auVar40 = vporq_avx512f(auVar38,auVar35);
      uVar4 = vpcmpuq_avx512f(auVar40,auVar30,2);
      uVar26 = vpcmpuq_avx512f(auVar39,auVar30,2);
      bVar24 = (byte)uVar26;
      bVar25 = (byte)uVar4;
      uVar27 = CONCAT11(bVar24,bVar25);
      auVar39 = vpgatherdd_avx512f(*(undefined4 *)((long)piVar8 + uVar14));
      iVar1 = (uint)(bVar25 & 1) * auVar39._0_4_;
      iVar3 = (uint)((byte)(uVar27 >> 1) & 1) * auVar39._4_4_;
      auVar29._4_4_ = iVar3;
      auVar29._0_4_ = iVar1;
      iVar9 = (uint)((byte)(uVar27 >> 2) & 1) * auVar39._8_4_;
      auVar29._8_4_ = iVar9;
      iVar22 = (uint)((byte)(uVar27 >> 3) & 1) * auVar39._12_4_;
      auVar29._12_4_ = iVar22;
      auVar29._16_4_ = (uint)((byte)(uVar27 >> 4) & 1) * auVar39._16_4_;
      auVar29._20_4_ = (uint)((byte)(uVar27 >> 5) & 1) * auVar39._20_4_;
      auVar29._24_4_ = (uint)((byte)(uVar27 >> 6) & 1) * auVar39._24_4_;
      auVar29._28_4_ = (uint)((byte)(uVar27 >> 7) & 1) * auVar39._28_4_;
      auVar38._32_4_ = (uint)(bVar24 & 1) * auVar39._32_4_;
      auVar38._0_32_ = auVar29;
      auVar38._36_4_ = (uint)(bVar24 >> 1 & 1) * auVar39._36_4_;
      auVar38._40_4_ = (uint)(bVar24 >> 2 & 1) * auVar39._40_4_;
      auVar38._44_4_ = (uint)(bVar24 >> 3 & 1) * auVar39._44_4_;
      auVar38._48_4_ = (uint)(bVar24 >> 4 & 1) * auVar39._48_4_;
      auVar38._52_4_ = (uint)(bVar24 >> 5 & 1) * auVar39._52_4_;
      auVar38._56_4_ = (uint)(bVar24 >> 6 & 1) * auVar39._56_4_;
      auVar38._60_4_ = (uint)(bVar24 >> 7) * auVar39._60_4_;
      if ((uVar4 & 1) != 0) {
        auVar40 = ZEXT464((uint)(iVar1 / (int)uVar18));
      }
      if ((uVar4 & 2) != 0) {
        auVar2 = vpinsrd_avx(auVar40._0_16_,iVar3 / (int)uVar18,1);
        auVar40 = vinserti32x4_avx512f(auVar40,auVar2,0);
      }
      if ((uVar4 & 4) != 0) {
        auVar2 = vpinsrd_avx(auVar40._0_16_,iVar9 / (int)uVar18,2);
        auVar40 = vinserti32x4_avx512f(auVar40,auVar2,0);
      }
      if ((uVar4 & 8) != 0) {
        auVar2 = vpinsrd_avx(auVar40._0_16_,iVar22 / (int)uVar18,3);
        auVar40 = vinserti32x4_avx512f(auVar40,auVar2,0);
      }
      auVar39 = auVar40;
      if ((uVar4 & 0x10) != 0) {
        auVar41 = vpbroadcastd_avx512f();
        auVar39._0_16_ = auVar40._0_16_;
        auVar39._16_4_ = auVar41._16_4_;
        auVar39._20_4_ = auVar40._20_4_;
        auVar39._24_4_ = auVar40._24_4_;
        auVar39._28_4_ = auVar40._28_4_;
        auVar39._32_4_ = auVar40._32_4_;
        auVar39._36_4_ = auVar40._36_4_;
        auVar39._40_4_ = auVar40._40_4_;
        auVar39._44_4_ = auVar40._44_4_;
        auVar39._48_4_ = auVar40._48_4_;
        auVar39._52_4_ = auVar40._52_4_;
        auVar39._56_4_ = auVar40._56_4_;
        auVar39._60_4_ = auVar40._60_4_;
      }
      auVar40 = auVar39;
      if ((uVar4 & 0x20) != 0) {
        auVar41 = vpbroadcastd_avx512f();
        auVar40._0_20_ = auVar39._0_20_;
        auVar40._20_4_ = auVar41._20_4_;
        auVar40._24_4_ = auVar39._24_4_;
        auVar40._28_4_ = auVar39._28_4_;
        auVar40._32_4_ = auVar39._32_4_;
        auVar40._36_4_ = auVar39._36_4_;
        auVar40._40_4_ = auVar39._40_4_;
        auVar40._44_4_ = auVar39._44_4_;
        auVar40._48_4_ = auVar39._48_4_;
        auVar40._52_4_ = auVar39._52_4_;
        auVar40._56_4_ = auVar39._56_4_;
        auVar40._60_4_ = auVar39._60_4_;
      }
      auVar41 = auVar40;
      if ((uVar4 & 0x40) != 0) {
        auVar39 = vpbroadcastd_avx512f();
        auVar41._0_24_ = auVar40._0_24_;
        auVar41._24_4_ = auVar39._24_4_;
        auVar41._28_4_ = auVar40._28_4_;
        auVar41._32_4_ = auVar40._32_4_;
        auVar41._36_4_ = auVar40._36_4_;
        auVar41._40_4_ = auVar40._40_4_;
        auVar41._44_4_ = auVar40._44_4_;
        auVar41._48_4_ = auVar40._48_4_;
        auVar41._52_4_ = auVar40._52_4_;
        auVar41._56_4_ = auVar40._56_4_;
        auVar41._60_4_ = auVar40._60_4_;
      }
      auVar42 = auVar41;
      if ((uVar4 & 0x80) != 0) {
        auVar39 = vpbroadcastd_avx512f();
        auVar42._0_28_ = auVar41._0_28_;
        auVar42._28_4_ = auVar39._28_4_;
        auVar42._32_4_ = auVar41._32_4_;
        auVar42._36_4_ = auVar41._36_4_;
        auVar42._40_4_ = auVar41._40_4_;
        auVar42._44_4_ = auVar41._44_4_;
        auVar42._48_4_ = auVar41._48_4_;
        auVar42._52_4_ = auVar41._52_4_;
        auVar42._56_4_ = auVar41._56_4_;
        auVar42._60_4_ = auVar41._60_4_;
      }
      vextracti32x4_avx512f(auVar38,2);
      auVar43 = auVar42;
      if ((uVar26 & 1) != 0) {
        auVar39 = vpbroadcastd_avx512f();
        auVar43._0_32_ = auVar42._0_32_;
        auVar43._32_4_ = auVar39._32_4_;
        auVar43._36_4_ = auVar42._36_4_;
        auVar43._40_4_ = auVar42._40_4_;
        auVar43._44_4_ = auVar42._44_4_;
        auVar43._48_4_ = auVar42._48_4_;
        auVar43._52_4_ = auVar42._52_4_;
        auVar43._56_4_ = auVar42._56_4_;
        auVar43._60_4_ = auVar42._60_4_;
      }
      auVar44 = auVar43;
      if ((uVar26 & 2) != 0) {
        auVar39 = vpbroadcastd_avx512f();
        auVar44._0_36_ = auVar43._0_36_;
        auVar44._36_4_ = auVar39._36_4_;
        auVar44._40_4_ = auVar43._40_4_;
        auVar44._44_4_ = auVar43._44_4_;
        auVar44._48_4_ = auVar43._48_4_;
        auVar44._52_4_ = auVar43._52_4_;
        auVar44._56_4_ = auVar43._56_4_;
        auVar44._60_4_ = auVar43._60_4_;
      }
      auVar45 = auVar44;
      if ((uVar26 & 4) != 0) {
        auVar39 = vpbroadcastd_avx512f();
        auVar45._0_40_ = auVar44._0_40_;
        auVar45._40_4_ = auVar39._40_4_;
        auVar45._44_4_ = auVar44._44_4_;
        auVar45._48_4_ = auVar44._48_4_;
        auVar45._52_4_ = auVar44._52_4_;
        auVar45._56_4_ = auVar44._56_4_;
        auVar45._60_4_ = auVar44._60_4_;
      }
      auVar46 = auVar45;
      if ((uVar26 & 8) != 0) {
        auVar39 = vpbroadcastd_avx512f();
        auVar46._0_44_ = auVar45._0_44_;
        auVar46._44_4_ = auVar39._44_4_;
        auVar46._48_4_ = auVar45._48_4_;
        auVar46._52_4_ = auVar45._52_4_;
        auVar46._56_4_ = auVar45._56_4_;
        auVar46._60_4_ = auVar45._60_4_;
      }
      vextracti32x4_avx512f(auVar38,3);
      auVar47 = auVar46;
      if ((uVar26 & 0x10) != 0) {
        auVar38 = vpbroadcastd_avx512f();
        auVar47._0_48_ = auVar46._0_48_;
        auVar47._48_4_ = auVar38._48_4_;
        auVar47._52_4_ = auVar46._52_4_;
        auVar47._56_4_ = auVar46._56_4_;
        auVar47._60_4_ = auVar46._60_4_;
      }
      auVar48 = auVar47;
      if ((uVar26 & 0x20) != 0) {
        auVar38 = vpbroadcastd_avx512f();
        auVar48._0_52_ = auVar47._0_52_;
        auVar48._52_4_ = auVar38._52_4_;
        auVar48._56_4_ = auVar47._56_4_;
        auVar48._60_4_ = auVar47._60_4_;
      }
      auVar49 = auVar48;
      if ((uVar26 & 0x40) != 0) {
        auVar38 = vpbroadcastd_avx512f();
        auVar49._0_56_ = auVar48._0_56_;
        auVar49._56_4_ = auVar38._56_4_;
        auVar49._60_4_ = auVar48._60_4_;
      }
      auVar50 = auVar49;
      if ((uVar26 & 0x80) != 0) {
        auVar38 = vpbroadcastd_avx512f();
        auVar50._60_4_ = auVar38._60_4_;
        auVar50._0_60_ = auVar49._0_60_;
      }
      auVar38 = vpbroadcastq_avx512f();
      auVar39 = vpaddq_avx512f(auVar38,auVar32);
      auVar38 = vpaddq_avx512f(auVar38,auVar33);
      auVar64 = auVar38._0_32_;
      vpscatterqd_avx512f(ZEXT832(4) + auVar64,uVar4,auVar50._0_32_);
      auVar28 = vextracti64x4_avx512f(auVar50,1);
      auVar40 = ZEXT3264(auVar28);
      auVar63 = auVar39._0_32_;
      vpscatterqd_avx512f(ZEXT832(4) + auVar63,uVar26,auVar28);
      if ((uVar4 & 1) != 0) {
        auVar40 = ZEXT464((uint)(iVar1 % (int)uVar18));
      }
      if ((uVar4 & 2) != 0) {
        auVar2 = vpinsrd_avx512dq(auVar40._0_16_,iVar3 % (int)uVar18,1);
        auVar40 = vinserti32x4_avx512f(auVar40,auVar2,0);
      }
      if ((uVar4 & 4) != 0) {
        auVar2 = vpinsrd_avx512dq(auVar40._0_16_,iVar9 % (int)uVar18,2);
        auVar40 = vinserti32x4_avx512f(auVar40,auVar2,0);
      }
      if ((uVar4 & 8) != 0) {
        auVar2 = vpinsrd_avx512dq(auVar40._0_16_,iVar22 % (int)uVar18,3);
        auVar40 = vinserti32x4_avx512f(auVar40,auVar2,0);
      }
      auVar51 = auVar40;
      if ((uVar4 & 0x10) != 0) {
        vextracti32x4_avx512vl(auVar29,1);
        auVar41 = vpbroadcastd_avx512f();
        auVar51._0_16_ = auVar40._0_16_;
        auVar51._16_4_ = auVar41._16_4_;
        auVar51._20_4_ = auVar40._20_4_;
        auVar51._24_4_ = auVar40._24_4_;
        auVar51._28_4_ = auVar40._28_4_;
        auVar51._32_4_ = auVar40._32_4_;
        auVar51._36_4_ = auVar40._36_4_;
        auVar51._40_4_ = auVar40._40_4_;
        auVar51._44_4_ = auVar40._44_4_;
        auVar51._48_4_ = auVar40._48_4_;
        auVar51._52_4_ = auVar40._52_4_;
        auVar51._56_4_ = auVar40._56_4_;
        auVar51._60_4_ = auVar40._60_4_;
      }
      auVar52 = auVar51;
      if ((uVar4 & 0x20) != 0) {
        vextracti32x4_avx512vl(auVar29,1);
        auVar40 = vpbroadcastd_avx512f();
        auVar52._0_20_ = auVar51._0_20_;
        auVar52._20_4_ = auVar40._20_4_;
        auVar52._24_4_ = auVar51._24_4_;
        auVar52._28_4_ = auVar51._28_4_;
        auVar52._32_4_ = auVar51._32_4_;
        auVar52._36_4_ = auVar51._36_4_;
        auVar52._40_4_ = auVar51._40_4_;
        auVar52._44_4_ = auVar51._44_4_;
        auVar52._48_4_ = auVar51._48_4_;
        auVar52._52_4_ = auVar51._52_4_;
        auVar52._56_4_ = auVar51._56_4_;
        auVar52._60_4_ = auVar51._60_4_;
      }
      auVar53 = auVar52;
      if ((uVar4 & 0x40) != 0) {
        vextracti32x4_avx512vl(auVar29,1);
        auVar40 = vpbroadcastd_avx512f();
        auVar53._0_24_ = auVar52._0_24_;
        auVar53._24_4_ = auVar40._24_4_;
        auVar53._28_4_ = auVar52._28_4_;
        auVar53._32_4_ = auVar52._32_4_;
        auVar53._36_4_ = auVar52._36_4_;
        auVar53._40_4_ = auVar52._40_4_;
        auVar53._44_4_ = auVar52._44_4_;
        auVar53._48_4_ = auVar52._48_4_;
        auVar53._52_4_ = auVar52._52_4_;
        auVar53._56_4_ = auVar52._56_4_;
        auVar53._60_4_ = auVar52._60_4_;
      }
      auVar54 = auVar53;
      if ((uVar4 & 0x80) != 0) {
        auVar40 = vpbroadcastd_avx512f();
        auVar54._0_28_ = auVar53._0_28_;
        auVar54._28_4_ = auVar40._28_4_;
        auVar54._32_4_ = auVar53._32_4_;
        auVar54._36_4_ = auVar53._36_4_;
        auVar54._40_4_ = auVar53._40_4_;
        auVar54._44_4_ = auVar53._44_4_;
        auVar54._48_4_ = auVar53._48_4_;
        auVar54._52_4_ = auVar53._52_4_;
        auVar54._56_4_ = auVar53._56_4_;
        auVar54._60_4_ = auVar53._60_4_;
      }
      auVar55 = auVar54;
      if ((uVar26 & 1) != 0) {
        auVar40 = vpbroadcastd_avx512f();
        auVar55._0_32_ = auVar54._0_32_;
        auVar55._32_4_ = auVar40._32_4_;
        auVar55._36_4_ = auVar54._36_4_;
        auVar55._40_4_ = auVar54._40_4_;
        auVar55._44_4_ = auVar54._44_4_;
        auVar55._48_4_ = auVar54._48_4_;
        auVar55._52_4_ = auVar54._52_4_;
        auVar55._56_4_ = auVar54._56_4_;
        auVar55._60_4_ = auVar54._60_4_;
      }
      auVar56 = auVar55;
      if ((uVar26 & 2) != 0) {
        auVar40 = vpbroadcastd_avx512f();
        auVar56._0_36_ = auVar55._0_36_;
        auVar56._36_4_ = auVar40._36_4_;
        auVar56._40_4_ = auVar55._40_4_;
        auVar56._44_4_ = auVar55._44_4_;
        auVar56._48_4_ = auVar55._48_4_;
        auVar56._52_4_ = auVar55._52_4_;
        auVar56._56_4_ = auVar55._56_4_;
        auVar56._60_4_ = auVar55._60_4_;
      }
      auVar57 = auVar56;
      if ((uVar26 & 4) != 0) {
        auVar40 = vpbroadcastd_avx512f();
        auVar57._0_40_ = auVar56._0_40_;
        auVar57._40_4_ = auVar40._40_4_;
        auVar57._44_4_ = auVar56._44_4_;
        auVar57._48_4_ = auVar56._48_4_;
        auVar57._52_4_ = auVar56._52_4_;
        auVar57._56_4_ = auVar56._56_4_;
        auVar57._60_4_ = auVar56._60_4_;
      }
      auVar58 = auVar57;
      if ((uVar26 & 8) != 0) {
        auVar40 = vpbroadcastd_avx512f();
        auVar58._0_44_ = auVar57._0_44_;
        auVar58._44_4_ = auVar40._44_4_;
        auVar58._48_4_ = auVar57._48_4_;
        auVar58._52_4_ = auVar57._52_4_;
        auVar58._56_4_ = auVar57._56_4_;
        auVar58._60_4_ = auVar57._60_4_;
      }
      auVar59 = auVar58;
      if ((uVar26 & 0x10) != 0) {
        auVar40 = vpbroadcastd_avx512f();
        auVar59._0_48_ = auVar58._0_48_;
        auVar59._48_4_ = auVar40._48_4_;
        auVar59._52_4_ = auVar58._52_4_;
        auVar59._56_4_ = auVar58._56_4_;
        auVar59._60_4_ = auVar58._60_4_;
      }
      auVar60 = auVar59;
      if ((uVar26 & 0x20) != 0) {
        auVar40 = vpbroadcastd_avx512f();
        auVar60._0_52_ = auVar59._0_52_;
        auVar60._52_4_ = auVar40._52_4_;
        auVar60._56_4_ = auVar59._56_4_;
        auVar60._60_4_ = auVar59._60_4_;
      }
      auVar61 = auVar60;
      if ((uVar26 & 0x40) != 0) {
        auVar40 = vpbroadcastd_avx512f();
        auVar61._0_56_ = auVar60._0_56_;
        auVar61._56_4_ = auVar40._56_4_;
        auVar61._60_4_ = auVar60._60_4_;
      }
      auVar62 = auVar61;
      if ((uVar26 & 0x80) != 0) {
        auVar40 = vpbroadcastd_avx512f();
        auVar62._60_4_ = auVar40._60_4_;
        auVar62._0_60_ = auVar61._0_60_;
      }
      auVar38 = vpaddq_avx512f(auVar38,auVar36);
      auVar39 = vpaddq_avx512f(auVar39,auVar36);
      vpscatterqd_avx512f(ZEXT832(0) + auVar64,uVar4,auVar62._0_32_);
      auVar29 = vextracti64x4_avx512f(auVar62,1);
      vpscatterqd_avx512f(ZEXT832(0) + auVar63,uVar26,auVar29);
      uVar23 = vpmovd2m_avx512dq(auVar62);
      auVar40 = vpaddd_avx512f(auVar62,auVar31);
      uVar26 = (ulong)(bVar25 & (byte)uVar23);
      vpscatterqd_avx512f(ZEXT832(0) + auVar64,uVar26,auVar40._0_32_);
      uVar4 = (ulong)(bVar24 & (byte)((ulong)uVar23 >> 8));
      auVar29 = vextracti64x4_avx512f(auVar40,1);
      vpscatterqd_avx512f(ZEXT832(0) + auVar63,uVar4,auVar29);
      auVar40 = vpaddd_avx512f(auVar50,auVar37);
      vpscatterqd_avx512f(ZEXT832(0) + auVar38._0_32_,uVar26,auVar40._0_32_);
      auVar29 = vextracti64x4_avx512f(auVar40,1);
      vpscatterqd_avx512f(ZEXT832(0) + auVar39._0_32_,uVar4,auVar29);
      uVar14 = uVar14 + 0x10;
      piVar8 = piVar8 + 0x30;
    } while (((ulong)((long)piVar17 + (-0xc - (long)piVar7)) / 0xc + 0x10 & 0xfffffffffffffff0) !=
             uVar14);
  }
  if (piVar7 != piVar17) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<(anonymous_namespace)::val_t*,std::vector<(anonymous_namespace)::val_t,std::allocator<(anonymous_namespace)::val_t>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar7,piVar17,
               (int)LZCOUNT(((long)piVar17 - (long)piVar7 >> 2) * -0x5555555555555555) * 2 ^ 0x7e);
    if ((long)piVar17 - (long)piVar7 < 0xc1) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::val_t*,std::vector<(anonymous_namespace)::val_t,std::allocator<(anonymous_namespace)::val_t>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (piVar7,piVar17);
    }
    else {
      piVar8 = piVar7 + 0x30;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::val_t*,std::vector<(anonymous_namespace)::val_t,std::allocator<(anonymous_namespace)::val_t>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (piVar7,piVar8);
      for (; piVar8 != piVar17; piVar8 = piVar8 + 3) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::val_t*,std::vector<(anonymous_namespace)::val_t,std::allocator<(anonymous_namespace)::val_t>>>,__gnu_cxx::__ops::_Val_less_iter>
                  (piVar8);
      }
    }
  }
  if (piVar7 != piVar17) {
    iVar22 = 0;
    iVar3 = 0;
    piVar8 = piVar7 + 1;
    iVar9 = -1;
    do {
      iVar1 = piVar8[-1];
      iVar15 = 0x7fffffff;
      iVar16 = 0x7fffffff;
      iVar19 = 0x7fffffff;
      if (iVar1 == iVar9) {
        iVar16 = *piVar8 - iVar3;
        iVar15 = *piVar8 * uVar18 + iVar1;
        iVar19 = iVar22;
      }
      iVar3 = *piVar8;
      iVar22 = piVar8[1];
      piVar8[-1] = iVar16;
      *piVar8 = iVar19;
      piVar8[1] = iVar15;
      piVar21 = piVar8 + 2;
      piVar8 = piVar8 + 3;
      iVar9 = iVar1;
    } while (piVar21 != piVar17);
  }
  if (piVar7 != piVar17) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<(anonymous_namespace)::val_t*,std::vector<(anonymous_namespace)::val_t,std::allocator<(anonymous_namespace)::val_t>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar7,piVar17,
               (int)LZCOUNT(((long)piVar17 - (long)piVar7 >> 2) * -0x5555555555555555) * 2 ^ 0x7e);
    if ((long)piVar17 - (long)piVar7 < 0xc1) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::val_t*,std::vector<(anonymous_namespace)::val_t,std::allocator<(anonymous_namespace)::val_t>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (piVar7,piVar17);
    }
    else {
      piVar8 = piVar7 + 0x30;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::val_t*,std::vector<(anonymous_namespace)::val_t,std::allocator<(anonymous_namespace)::val_t>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (piVar7,piVar8);
      for (; piVar8 != piVar17; piVar8 = piVar8 + 3) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::val_t*,std::vector<(anonymous_namespace)::val_t,std::allocator<(anonymous_namespace)::val_t>>>,__gnu_cxx::__ops::_Val_less_iter>
                  (piVar8);
      }
    }
  }
  iVar3 = printf("Day 01 Part 1: %d\nDay 01 Part 2: %d\n",(ulong)uVar18,(ulong)(uint)piVar7[2]);
  if (piVar7 == (int *)0x0) {
    return iVar3;
  }
  operator_delete(piVar7,(long)piVar13 - (long)piVar7);
  return extraout_EAX;
}

Assistant:

int main() {
	double total_time = 0;

	for (auto &A : advent2018) {
		input_t input;

		load_input(input, A.input_file);
		auto t0 = std::chrono::steady_clock::now();
		(*A.fn)(input);
		auto elapsed = std::chrono::steady_clock::now() - t0;
		free_input(input);

		total_time += elapsed.count();
		printf("[%ld μs]\n", int64_t(elapsed.count() * 1e-3));
	}
	printf("Total: %ld μs\n", int64_t(total_time * 1e-3));

	return 0;
}